

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * VmNewOperandStack(jx9_vm *pVm,sxu32 nInstr)

{
  jx9_value *pStack;
  sxu32 nInstr_local;
  jx9_vm *pVm_local;
  
  pStack._4_4_ = nInstr + 0x10;
  pVm_local = (jx9_vm *)SyMemBackendAlloc(&pVm->sAllocator,pStack._4_4_ * 0x40);
  if (pVm_local == (jx9_vm *)0x0) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    for (; pStack._4_4_ != 0; pStack._4_4_ = pStack._4_4_ + -1) {
      jx9MemObjInit(pVm,(jx9_value *)
                        ((pVm_local->sAllocator).apPool + (ulong)(pStack._4_4_ - 1) * 8 + -8));
    }
  }
  return (jx9_value *)pVm_local;
}

Assistant:

static jx9_value * VmNewOperandStack(
	jx9_vm *pVm, /* Target VM */
	sxu32 nInstr /* Total numer of generated bytecode instructions */
	)
{
	jx9_value *pStack;
  /* No instruction ever pushes more than a single element onto the
  ** stack and the stack never grows on successive executions of the
  ** same loop. So the total number of instructions is an upper bound
  ** on the maximum stack depth required.
  **
  ** Allocation all the stack space we will ever need.
  */
	nInstr += VM_STACK_GUARD;
	pStack = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator, nInstr * sizeof(jx9_value));
	if( pStack == 0 ){
		return 0;
	}
	/* Initialize the operand stack */
	while( nInstr > 0 ){
		jx9MemObjInit(&(*pVm), &pStack[nInstr - 1]);
		--nInstr;
	}
	/* Ready for bytecode execution */
	return pStack;
}